

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_mput.c
# Opt level: O2

void free_state(ufile_mutipart_state *state)

{
  etag_slist *__ptr;
  curls_list *__ptr_00;
  list_node *plVar1;
  list_node *__ptr_01;
  
  free(state->key);
  free(state->bucket_name);
  free(state->upload_id);
  __ptr = state->etags;
  free(__ptr->etag_buf);
  free(__ptr);
  __ptr_00 = state->curls;
  __ptr_01 = __ptr_00->head;
  while (__ptr_01->next != (list_node *)0x0) {
    curl_easy_cleanup(__ptr_01->curl);
    plVar1 = __ptr_01->next;
    free(__ptr_01);
    __ptr_01 = plVar1;
  }
  free(__ptr_00);
  return;
}

Assistant:

static void
free_state(struct ufile_mutipart_state *state){
    free((char*)state->key);
    free((char*)state->bucket_name);
    free((char*)state->upload_id);

    struct etag_slist *list = state->etags;
    free(list->etag_buf);
    free(list);
    struct curls_list *L = state->curls;
    struct list_node *h = L->head;
    while(h->next!=NULL){
        curl_easy_cleanup(h->curl);
        struct list_node *n = h;
        h=h->next;
        free(n);
    }
    free(L);
}